

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

uint32_t __thiscall jpgd::jpeg_decoder::H2V2ConvertFiltered(jpeg_decoder *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  uint8 uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint8 *puVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  uint8_t (*pauVar27) [4];
  uint8 *puVar28;
  long in_RDI;
  int bc_4;
  int gc_4;
  int rc_4;
  int cr_4;
  int cb_4;
  uint8_t *pMuls_4;
  int cr11_sample_1;
  int cb11_sample_1;
  int cr10_sample_1;
  int cb10_sample_1;
  int b_1;
  int cr01_sample_1;
  int cb01_sample_1;
  int cr00_sample_1;
  int cb00_sample_1;
  int a_1;
  int c_x1_1;
  int c_x0_1;
  int y_sample;
  int x_1;
  int bc_3;
  int gc_3;
  int rc_3;
  int cr_3;
  int cb_3;
  uint8_t *pMuls_3;
  int bc_2;
  int gc_2;
  int rc_2;
  int cr_2;
  int cb_2;
  uint8_t *pMuls_2;
  int nx;
  int bc_1;
  int gc_1;
  int rc_1;
  int cr_1;
  int cb_1;
  uint8_t *pMuls_1;
  int bc;
  int gc;
  int rc;
  int cr;
  int cb;
  uint8_t *pMuls;
  int cr11_sample;
  int cb11_sample;
  int cr10_sample;
  int cb10_sample;
  int b;
  int cr01_sample;
  int cb01_sample;
  int cr00_sample;
  int cb00_sample;
  int a;
  int c_x1;
  int c_x0;
  int y_sample1;
  int y_sample0;
  int k;
  int x;
  int y_sample_base_ofs1;
  uint8 *d1;
  int half_image_x_size;
  int y1_base;
  int y0_base;
  int y_sample_base_ofs;
  uint8_t *p_C0Samples;
  uint8_t *p_YSamples;
  int c_y1;
  int c_y0;
  uint8 *d0;
  int half_image_y_size;
  int row;
  int y;
  uint BLOCKS_PER_MCU;
  int in_stack_fffffffffffffdbc;
  jpeg_decoder *in_stack_fffffffffffffdc0;
  int local_1a0;
  uint local_120;
  uint local_60;
  uint8 *local_58;
  jpeg_decoder *local_40;
  long local_38;
  uint8 *local_28;
  uint32_t local_4;
  
  uVar22 = *(int *)(in_RDI + 0xdc) - *(int *)(in_RDI + 0x284);
  uVar23 = uVar22 & 0xf;
  local_28 = *(uint8 **)(in_RDI + 0x34b8);
  iVar11 = (int)(uVar22 - 1) >> 1;
  local_38 = *(long *)(in_RDI + 0x24a8);
  local_40 = *(jpeg_decoder **)(in_RDI + 0x24a8);
  if ((-1 < iVar11) && (((uVar23 == 0 || (uVar23 == 0xf)) && (1 < *(int *)(in_RDI + 0x284))))) {
    if ((int)uVar22 < 1) {
      __assert_fail("y > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x73c,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if ((*(byte *)(in_RDI + 0x34d2) & 1) == 0) {
      __assert_fail("m_sample_buf_prev_valid",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x73d,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (uVar23 == 0xf) {
      local_38 = *(long *)(in_RDI + 0x24b0);
    }
    local_40 = *(jpeg_decoder **)(in_RDI + 0x24b0);
  }
  if ((uVar23 == 0) || (0xe < uVar23)) {
    for (local_120 = 0; (int)local_120 < *(int *)(in_RDI + 0xd8); local_120 = local_120 + 1) {
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      uVar23 = (uint)*(byte *)(local_38 + iVar11);
      in_stack_fffffffffffffdc0 = local_40;
      iVar11 = check_sample_buf_ofs(local_40,in_stack_fffffffffffffdbc);
      bVar1 = *(byte *)((long)in_stack_fffffffffffffdc0->m_jmp_state[0].__jmpbuf + (long)iVar11);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      bVar2 = *(byte *)((long)local_40->m_jmp_state[0].__jmpbuf + (long)iVar11);
      lVar9 = *(long *)(in_RDI + 0x24a8);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      bVar3 = *(byte *)(lVar9 + iVar11);
      lVar9 = *(long *)(in_RDI + 0x24a8);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      bVar4 = *(byte *)(lVar9 + iVar11);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      bVar5 = *(byte *)((long)local_40->m_jmp_state[0].__jmpbuf + (long)iVar11);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      bVar6 = *(byte *)((long)local_40->m_jmp_state[0].__jmpbuf + (long)iVar11);
      lVar9 = *(long *)(in_RDI + 0x24a8);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      bVar7 = *(byte *)(lVar9 + iVar11);
      lVar9 = *(long *)(in_RDI + 0x24a8);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      pauVar27 = H2V2ConvertFiltered::s_muls[(int)(uVar22 & 1)] + (int)(local_120 & 1);
      iVar25 = (int)((uint)bVar1 * (uint)(*pauVar27)[0] + (uint)bVar3 * (uint)(*pauVar27)[1] +
                     (uint)bVar5 * (uint)(*pauVar27)[2] + (uint)bVar7 * (uint)(*pauVar27)[3] + 8) >>
               4;
      iVar26 = (int)((uint)bVar2 * (uint)(*pauVar27)[0] + (uint)bVar4 * (uint)(*pauVar27)[1] +
                     (uint)bVar6 * (uint)(*pauVar27)[2] +
                     (uint)*(byte *)(lVar9 + iVar11) * (uint)(*pauVar27)[3] + 8) >> 4;
      iVar11 = *(int *)(in_RDI + 0x2cb8 + (long)iVar26 * 4);
      iVar8 = *(int *)(in_RDI + 0x30b8 + (long)iVar25 * 4);
      iVar25 = *(int *)(in_RDI + 0x28b8 + (long)iVar25 * 4);
      uVar10 = clamp(uVar23 + *(int *)(in_RDI + 0x24b8 + (long)iVar26 * 4));
      *local_28 = uVar10;
      uVar10 = clamp(uVar23 + (iVar11 + iVar8 >> 0x10));
      local_28[1] = uVar10;
      uVar10 = clamp(uVar23 + iVar25);
      local_28[2] = uVar10;
      local_28[3] = 0xff;
      local_28 = local_28 + 4;
    }
    local_4 = 1;
  }
  else {
    if ((uVar22 & 1) != 1) {
      __assert_fail("(row & 1) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x753,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if ((int)uVar22 >> 1 != iVar11) {
      __assert_fail("((y + 1 - 1) >> 1) == c_y0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x754,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (local_38 != *(long *)(in_RDI + 0x24a8)) {
      __assert_fail("p_YSamples == m_pSample_buf",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x756,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    if (local_40 != *(jpeg_decoder **)(in_RDI + 0x24a8)) {
      __assert_fail("p_C0Samples == m_pSample_buf",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x757,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
    }
    local_58 = *(uint8 **)(in_RDI + 0x34c0);
    for (local_60 = 0; (int)local_60 < *(int *)(in_RDI + 0xd8); local_60 = local_60 + 1) {
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      uVar12 = (uint)*(byte *)(local_38 + iVar11);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      uVar13 = (uint)*(byte *)(local_38 + iVar11);
      local_1a0 = (int)(local_60 - 1) >> 1;
      if (local_1a0 < 1) {
        local_1a0 = 0;
      }
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      uVar14 = (uint)*(byte *)((long)local_40->m_jmp_state[0].__jmpbuf + (long)iVar11);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      uVar15 = (uint)*(byte *)((long)local_40->m_jmp_state[0].__jmpbuf + (long)iVar11);
      lVar9 = *(long *)(in_RDI + 0x24a8);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      uVar16 = (uint)*(byte *)(lVar9 + iVar11);
      lVar9 = *(long *)(in_RDI + 0x24a8);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      uVar17 = (uint)*(byte *)(lVar9 + iVar11);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      uVar18 = (uint)*(byte *)((long)local_40->m_jmp_state[0].__jmpbuf + (long)iVar11);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      uVar19 = (uint)*(byte *)((long)local_40->m_jmp_state[0].__jmpbuf + (long)iVar11);
      lVar9 = *(long *)(in_RDI + 0x24a8);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      uVar20 = (uint)*(byte *)(lVar9 + iVar11);
      lVar9 = *(long *)(in_RDI + 0x24a8);
      iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
      uVar24 = (uint)*(byte *)(lVar9 + iVar11);
      pauVar27 = H2V2ConvertFiltered::s_muls[(int)(uVar22 & 1)] + (int)(local_60 & 1);
      iVar25 = (int)(uVar14 * (*pauVar27)[0] + uVar16 * (*pauVar27)[1] + uVar18 * (*pauVar27)[2] +
                     uVar20 * (*pauVar27)[3] + 8) >> 4;
      iVar26 = (int)(uVar15 * (*pauVar27)[0] + uVar17 * (*pauVar27)[1] + uVar19 * (*pauVar27)[2] +
                     uVar24 * (*pauVar27)[3] + 8) >> 4;
      iVar11 = *(int *)(in_RDI + 0x2cb8 + (long)iVar26 * 4);
      iVar8 = *(int *)(in_RDI + 0x30b8 + (long)iVar25 * 4);
      iVar25 = *(int *)(in_RDI + 0x28b8 + (long)iVar25 * 4);
      uVar10 = clamp(uVar12 + *(int *)(in_RDI + 0x24b8 + (long)iVar26 * 4));
      *local_28 = uVar10;
      uVar10 = clamp(uVar12 + (iVar11 + iVar8 >> 0x10));
      local_28[1] = uVar10;
      uVar10 = clamp(uVar12 + iVar25);
      local_28[2] = uVar10;
      local_28[3] = 0xff;
      puVar28 = local_28 + 4;
      pauVar27 = H2V2ConvertFiltered::s_muls[(int)(uVar23 + 1 & 1)] + (int)(local_60 & 1);
      iVar25 = (int)(uVar14 * (*pauVar27)[0] + uVar16 * (*pauVar27)[1] + uVar18 * (*pauVar27)[2] +
                     uVar20 * (*pauVar27)[3] + 8) >> 4;
      iVar26 = (int)(uVar15 * (*pauVar27)[0] + uVar17 * (*pauVar27)[1] + uVar19 * (*pauVar27)[2] +
                     uVar24 * (*pauVar27)[3] + 8) >> 4;
      iVar11 = *(int *)(in_RDI + 0x2cb8 + (long)iVar26 * 4);
      iVar8 = *(int *)(in_RDI + 0x30b8 + (long)iVar25 * 4);
      iVar25 = *(int *)(in_RDI + 0x28b8 + (long)iVar25 * 4);
      uVar10 = clamp(uVar13 + *(int *)(in_RDI + 0x24b8 + (long)iVar26 * 4));
      *local_58 = uVar10;
      uVar10 = clamp(uVar13 + (iVar11 + iVar8 >> 0x10));
      local_58[1] = uVar10;
      uVar10 = clamp(uVar13 + iVar25);
      local_58[2] = uVar10;
      local_58[3] = 0xff;
      puVar21 = local_58 + 4;
      if (((local_60 & 1) == 1) && ((int)local_60 < *(int *)(in_RDI + 0xd8) + -1)) {
        if (local_1a0 != (int)local_60 >> 1) {
          __assert_fail("c_x0 == (nx - 1) >> 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                        ,0x799,"uint32_t jpgd::jpeg_decoder::H2V2ConvertFiltered()");
        }
        iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
        uVar12 = (uint)*(byte *)(local_38 + iVar11);
        iVar11 = check_sample_buf_ofs(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
        uVar13 = (uint)*(byte *)(local_38 + iVar11);
        pauVar27 = H2V2ConvertFiltered::s_muls[(int)(uVar22 & 1)] + (int)(local_60 + 1 & 1);
        iVar25 = (int)(uVar14 * (*pauVar27)[0] + uVar16 * (*pauVar27)[1] + uVar18 * (*pauVar27)[2] +
                       uVar20 * (*pauVar27)[3] + 8) >> 4;
        iVar26 = (int)(uVar15 * (*pauVar27)[0] + uVar17 * (*pauVar27)[1] + uVar19 * (*pauVar27)[2] +
                       uVar24 * (*pauVar27)[3] + 8) >> 4;
        iVar11 = *(int *)(in_RDI + 0x2cb8 + (long)iVar26 * 4);
        iVar8 = *(int *)(in_RDI + 0x30b8 + (long)iVar25 * 4);
        iVar25 = *(int *)(in_RDI + 0x28b8 + (long)iVar25 * 4);
        uVar10 = clamp(uVar12 + *(int *)(in_RDI + 0x24b8 + (long)iVar26 * 4));
        *puVar28 = uVar10;
        uVar10 = clamp(uVar12 + (iVar11 + iVar8 >> 0x10));
        local_28[5] = uVar10;
        uVar10 = clamp(uVar12 + iVar25);
        local_28[6] = uVar10;
        local_28[7] = 0xff;
        pauVar27 = H2V2ConvertFiltered::s_muls[(int)(uVar23 + 1 & 1)] + (int)(local_60 + 1 & 1);
        iVar25 = (int)(uVar14 * (*pauVar27)[0] + uVar16 * (*pauVar27)[1] + uVar18 * (*pauVar27)[2] +
                       uVar20 * (*pauVar27)[3] + 8) >> 4;
        iVar26 = (int)(uVar15 * (*pauVar27)[0] + uVar17 * (*pauVar27)[1] + uVar19 * (*pauVar27)[2] +
                       uVar24 * (*pauVar27)[3] + 8) >> 4;
        iVar11 = *(int *)(in_RDI + 0x2cb8 + (long)iVar26 * 4);
        iVar8 = *(int *)(in_RDI + 0x30b8 + (long)iVar25 * 4);
        iVar25 = *(int *)(in_RDI + 0x28b8 + (long)iVar25 * 4);
        uVar10 = clamp(uVar13 + *(int *)(in_RDI + 0x24b8 + (long)iVar26 * 4));
        *puVar21 = uVar10;
        uVar10 = clamp(uVar13 + (iVar11 + iVar8 >> 0x10));
        local_58[5] = uVar10;
        uVar10 = clamp(uVar13 + iVar25);
        local_58[6] = uVar10;
        local_58[7] = 0xff;
        local_60 = local_60 + 1;
        puVar21 = local_58 + 8;
        puVar28 = local_28 + 8;
      }
      local_28 = puVar28;
      local_58 = puVar21;
    }
    local_4 = 2;
  }
  return local_4;
}

Assistant:

uint32_t jpeg_decoder::H2V2ConvertFiltered()
	{
		const uint BLOCKS_PER_MCU = 6;
		int y = m_image_y_size - m_total_lines_left;
		int row = y & 15;

		const int half_image_y_size = (m_image_y_size >> 1) - 1;

		uint8* d0 = m_pScan_line_0;

		int c_y0 = (y - 1) >> 1;
		int c_y1 = JPGD_MIN(c_y0 + 1, half_image_y_size);

		const uint8_t* p_YSamples = m_pSample_buf;
		const uint8_t* p_C0Samples = m_pSample_buf;
		if ((c_y0 >= 0) && (((row & 15) == 0) || ((row & 15) == 15)) && (m_total_lines_left > 1))
		{
			assert(y > 0);
			assert(m_sample_buf_prev_valid);

			if ((row & 15) == 15)
				p_YSamples = m_pSample_buf_prev;

			p_C0Samples = m_pSample_buf_prev;
		}

		const int y_sample_base_ofs = ((row & 8) ? 128 : 0) + (row & 7) * 8;
		const int y0_base = (c_y0 & 7) * 8 + 256;
		const int y1_base = (c_y1 & 7) * 8 + 256;

		const int half_image_x_size = (m_image_x_size >> 1) - 1;

		static const uint8_t s_muls[2][2][4] =
		{
			{ { 1, 3, 3, 9 }, { 3, 9, 1, 3 }, },
			{ { 3, 1, 9, 3 }, { 9, 3, 3, 1 } }
		};

		if (((row & 15) >= 1) && ((row & 15) <= 14))
		{
			assert((row & 1) == 1);
			assert(((y + 1 - 1) >> 1) == c_y0);

			assert(p_YSamples == m_pSample_buf);
			assert(p_C0Samples == m_pSample_buf);

			uint8* d1 = m_pScan_line_1;
			const int y_sample_base_ofs1 = (((row + 1) & 8) ? 128 : 0) + ((row + 1) & 7) * 8;

			for (int x = 0; x < m_image_x_size; x++)
			{
				int k = (x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7);
				int y_sample0 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs)];
				int y_sample1 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs1)];

				int c_x0 = (x - 1) >> 1;
				int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
				c_x0 = JPGD_MAX(c_x0, 0);

				int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7);
				int cb00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base)];
				int cr00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base + 64)];

				int cb01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base)];
				int cr01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base + 64)];

				int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7);
				int cb10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base)];
				int cr10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base + 64)];

				int cb11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base)];
				int cr11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base + 64)];

				{
					const uint8_t* pMuls = &s_muls[row & 1][x & 1][0];
					int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
					int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					d0[0] = clamp(y_sample0 + rc);
					d0[1] = clamp(y_sample0 + gc);
					d0[2] = clamp(y_sample0 + bc);
					d0[3] = 255;

					d0 += 4;
				}

				{
					const uint8_t* pMuls = &s_muls[(row + 1) & 1][x & 1][0];
					int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
					int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					d1[0] = clamp(y_sample1 + rc);
					d1[1] = clamp(y_sample1 + gc);
					d1[2] = clamp(y_sample1 + bc);
					d1[3] = 255;

					d1 += 4;
				}

				if (((x & 1) == 1) && (x < m_image_x_size - 1))
				{
					const int nx = x + 1;
					assert(c_x0 == (nx - 1) >> 1);

					k = (nx >> 4) * BLOCKS_PER_MCU * 64 + ((nx & 8) ? 64 : 0) + (nx & 7);
					y_sample0 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs)];
					y_sample1 = p_YSamples[check_sample_buf_ofs(k + y_sample_base_ofs1)];

					{
						const uint8_t* pMuls = &s_muls[row & 1][nx & 1][0];
						int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
						int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

						int rc = m_crr[cr];
						int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
						int bc = m_cbb[cb];

						d0[0] = clamp(y_sample0 + rc);
						d0[1] = clamp(y_sample0 + gc);
						d0[2] = clamp(y_sample0 + bc);
						d0[3] = 255;

						d0 += 4;
					}

					{
						const uint8_t* pMuls = &s_muls[(row + 1) & 1][nx & 1][0];
						int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
						int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

						int rc = m_crr[cr];
						int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
						int bc = m_cbb[cb];

						d1[0] = clamp(y_sample1 + rc);
						d1[1] = clamp(y_sample1 + gc);
						d1[2] = clamp(y_sample1 + bc);
						d1[3] = 255;

						d1 += 4;
					}

					++x;
				}
			}

			return 2;
		}
		else
		{
			for (int x = 0; x < m_image_x_size; x++)
			{
				int y_sample = p_YSamples[check_sample_buf_ofs((x >> 4) * BLOCKS_PER_MCU * 64 + ((x & 8) ? 64 : 0) + (x & 7) + y_sample_base_ofs)];

				int c_x0 = (x - 1) >> 1;
				int c_x1 = JPGD_MIN(c_x0 + 1, half_image_x_size);
				c_x0 = JPGD_MAX(c_x0, 0);

				int a = (c_x0 >> 3) * BLOCKS_PER_MCU * 64 + (c_x0 & 7);
				int cb00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base)];
				int cr00_sample = p_C0Samples[check_sample_buf_ofs(a + y0_base + 64)];

				int cb01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base)];
				int cr01_sample = m_pSample_buf[check_sample_buf_ofs(a + y1_base + 64)];

				int b = (c_x1 >> 3) * BLOCKS_PER_MCU * 64 + (c_x1 & 7);
				int cb10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base)];
				int cr10_sample = p_C0Samples[check_sample_buf_ofs(b + y0_base + 64)];

				int cb11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base)];
				int cr11_sample = m_pSample_buf[check_sample_buf_ofs(b + y1_base + 64)];

				const uint8_t* pMuls = &s_muls[row & 1][x & 1][0];
				int cb = (cb00_sample * pMuls[0] + cb01_sample * pMuls[1] + cb10_sample * pMuls[2] + cb11_sample * pMuls[3] + 8) >> 4;
				int cr = (cr00_sample * pMuls[0] + cr01_sample * pMuls[1] + cr10_sample * pMuls[2] + cr11_sample * pMuls[3] + 8) >> 4;

				int rc = m_crr[cr];
				int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
				int bc = m_cbb[cb];

				d0[0] = clamp(y_sample + rc);
				d0[1] = clamp(y_sample + gc);
				d0[2] = clamp(y_sample + bc);
				d0[3] = 255;

				d0 += 4;
			}

			return 1;
		}
	}